

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuTextField::MenuEvent(FOptionMenuTextField *this,int mkey,bool fromcontroller)

{
  char *__src;
  DTextEnterMenu *this_00;
  float volume;
  UCVarValue vval;
  DMenu *input;
  byte local_1d;
  int local_1c;
  bool fromcontroller_local;
  FOptionMenuTextField *pFStack_18;
  int mkey_local;
  FOptionMenuTextField *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pFStack_18 = this;
  if (mkey == 6) {
    FSoundID::FSoundID((FSoundID *)((long)&input + 4),"menu/choose");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,(FSoundID *)((long)&input + 4),volume,0.0);
    __src = FOptionMenuFieldBase::GetCVarString(&this->super_FOptionMenuFieldBase);
    strcpy(this->mEditName,__src);
    this->mEntering = true;
    this_00 = (DTextEnterMenu *)DObject::operator_new((DObject *)0x58,(size_t)__src);
    DTextEnterMenu::DTextEnterMenu
              (this_00,DMenu::CurrentMenu,this->mEditName,0x80,2,(bool)(local_1d & 1),false);
    M_ActivateMenu((DMenu *)this_00);
    this_local._7_1_ = true;
  }
  else if (mkey == 10) {
    if ((this->super_FOptionMenuFieldBase).mCVar != (FBaseCVar *)0x0) {
      FBaseCVar::SetGenericRep
                ((this->super_FOptionMenuFieldBase).mCVar,(UCVarValue)this->mEditName,CVAR_String);
    }
    this->mEntering = false;
    this_local._7_1_ = true;
  }
  else if (mkey == 0xb) {
    this->mEntering = false;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
  }
  return this_local._7_1_;
}

Assistant:

bool MenuEvent ( int mkey, bool fromcontroller )
	{
		if ( mkey == MKEY_Enter )
		{
			S_Sound( CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE );
			strcpy( mEditName, GetCVarString() );
			mEntering = true;
			DMenu* input = new DTextEnterMenu ( DMenu::CurrentMenu, mEditName, sizeof mEditName, 2, fromcontroller );
			M_ActivateMenu( input );
			return true;
		}
		else if ( mkey == MKEY_Input )
		{
			if ( mCVar )
			{
				UCVarValue vval;
				vval.String = mEditName;
				mCVar->SetGenericRep( vval, CVAR_String );
			}

			mEntering = false;
			return true;
		}
		else if ( mkey == MKEY_Abort )
		{
			mEntering = false;
			return true;
		}

		return FOptionMenuItem::MenuEvent( mkey, fromcontroller );
	}